

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

DynamicType *
Js::PathTypeHandlerBase::CreateTypeForNewScObject
          (ScriptContext *scriptContext,DynamicType *type,PropertyIdArray *propIds,bool shareType)

{
  uint uVar1;
  Type propId;
  PathTypeHandlerBase *this;
  PathTypeSuccessorInfo *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DynamicType *pDVar5;
  ulong uVar6;
  ulong uVar7;
  PathTypeSuccessorKey local_68;
  PathTypeSuccessorKey local_60;
  PropertyIdArray *local_58;
  RecyclerWeakReference<Js::DynamicType> *local_50;
  RecyclerWeakReference<Js::DynamicType> *nextTypeWeakRef;
  ScriptContext *local_40;
  PropertyIndex local_32 [4];
  PropertyIndex propertyIndex;
  
  local_40 = scriptContext;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x775,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = propIds->count;
  uVar6 = (ulong)uVar1;
  bVar3 = propIds->has__proto__;
  if (((bVar3 != false) || (0x7f < propIds->count)) || (propIds->hadDuplicates != false)) {
    if (uVar1 < 0xffff) {
      pDVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
               CreateTypeForNewScObject(local_40,type,propIds,shareType,bVar3);
      return pDVar5;
    }
    if (0x3fffffff < uVar1) {
      Throw::OutOfMemory();
    }
    pDVar5 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
             CreateTypeForNewScObject(local_40,type,propIds,shareType,bVar3);
    return pDVar5;
  }
  local_40->objectLiteralCount[uVar6] = local_40->objectLiteralCount[uVar6] + 1;
  if (uVar6 != 0) {
    uVar7 = 0;
    nextTypeWeakRef._4_4_ = (uint)shareType;
    local_58 = propIds;
    do {
      this = (PathTypeHandlerBase *)(type->typeHandler).ptr;
      propId = (&local_58[1].count)[uVar7];
      local_32[0] = TypePath::LookupInline
                              ((this->typePath).ptr,propId,
                               (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
      if (local_32[0] == 0xffff) {
        PathTypeSuccessorKey::PathTypeSuccessorKey(&local_68,propId,ObjectSlotAttr_Default);
        this_00 = (this->successorInfo).ptr;
        if (this_00 == (PathTypeSuccessorInfo *)0x0) {
          local_50 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
LAB_00dd24f7:
          local_40->objectLiteralPathCount = local_40->objectLiteralPathCount + 1;
        }
        else {
          bVar3 = PathTypeSuccessorInfo::GetSuccessor(this_00,local_68,&local_50);
          if ((!bVar3) || ((local_50->super_RecyclerWeakReferenceBase).strongRef == (Type)0x0))
          goto LAB_00dd24f7;
        }
        PathTypeSuccessorKey::PathTypeSuccessorKey(&local_60,propId,ObjectSlotAttr_Default);
        type = PromoteType<true>(this,type,local_60,SUB41(nextTypeWeakRef._4_4_,0),local_40,
                                 (DynamicObject *)0x0,local_32);
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
  }
  return type;
}

Assistant:

DynamicType* PathTypeHandlerBase::CreateTypeForNewScObject(ScriptContext* scriptContext, DynamicType* type, const Js::PropertyIdArray *propIds, bool shareType)
    {
        Assert(scriptContext);
        uint count = propIds->count;

        bool check__proto__;
        if (UsePathTypeHandlerForObjectLiteral(propIds, &check__proto__))
        {
#ifdef PROFILE_OBJECT_LITERALS
            scriptContext->objectLiteralCount[count]++;
#endif
            for (uint i = 0; i < count; i++)
            {
                PathTypeHandlerBase *pathHandler = (PathTypeHandlerBase *)PointerValue(type->typeHandler);
                Js::PropertyId propertyId = propIds->elements[i];

                PropertyIndex propertyIndex = pathHandler->GetPropertyIndex(propertyId);

                if (propertyIndex != Constants::NoSlot)
                {
                    continue;
                }

#ifdef PROFILE_OBJECT_LITERALS
                {
                    RecyclerWeakReference<DynamicType>* nextTypeWeakRef;
                    if (!pathHandler->GetSuccessor(PathTypeSuccessorKey(propertyId, ObjectSlotAttr_Default), &nextTypeWeakRef) || nextTypeWeakRef->Get() == nullptr)
                    {
                        scriptContext->objectLiteralPathCount++;
                    }
                }
#endif
                type = pathHandler->PromoteType<true>(type, PathTypeSuccessorKey(propertyId, ObjectSlotAttr_Default), shareType, scriptContext, nullptr, &propertyIndex);
            }
        }
        else if (count <= static_cast<uint>(SimpleDictionaryTypeHandler::MaxPropertyIndexSize))
        {
            type = SimpleDictionaryTypeHandler::CreateTypeForNewScObject(scriptContext, type, propIds, shareType, check__proto__);
        }
        else if (count <= static_cast<uint>(BigSimpleDictionaryTypeHandler::MaxPropertyIndexSize))
        {
            type = BigSimpleDictionaryTypeHandler::CreateTypeForNewScObject(scriptContext, type, propIds, shareType, check__proto__);
        }
        else
        {
            Throw::OutOfMemory();
        }

        return type;
    }